

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  bool bVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  cmConditionEvaluator *this_00;
  int reducible;
  iterator arg;
  int local_54;
  iterator local_50;
  MessageType *local_48;
  iterator local_40;
  iterator local_38;
  
  local_48 = status;
  do {
    local_54 = 0;
    for (p_Var3 = (newArgs->
                  super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)newArgs;
        p_Var3 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      p_Var1 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var1 != (_List_node_base *)newArgs) {
        local_50._M_node = p_Var3;
        local_40._M_node = p_Var1;
        bVar2 = IsKeyword(this,&keyNOT_abi_cxx11_,(cmExpandedCommandArgument *)(p_Var3 + 1));
        if (bVar2) {
          this_00 = this;
          bVar2 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(p_Var1 + 1),errorString,local_48,
                             false);
          HandlePredicate(this_00,!bVar2,&local_54,&local_50,newArgs,&local_40,&local_38);
        }
      }
    }
  } while (local_54 != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && IsKeyword(keyNOT, *arg)) {
        bool rhs = this->GetBooleanValueWithAutoDereference(
          *argP1, errorString, status);
        this->HandlePredicate(!rhs, reducible, arg, newArgs, argP1, argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}